

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

bool __thiscall Database::empty(Database *this)

{
  bool bVar1;
  iterator iStack_58;
  iterator local_38;
  
  begin(&local_38,this);
  end(&iStack_58,this);
  bVar1 = iterator::operator==(&local_38,&iStack_58);
  return bVar1;
}

Assistant:

bool Database::empty ()
{
  return Database::begin () == Database::end ();
}